

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool enchant_spell(wchar_t num_hit,wchar_t num_dam,wchar_t num_ac,command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  code *tester;
  char *pcVar3;
  char *pcVar4;
  item_tester filter;
  wchar_t itemmode;
  char *s;
  char *q;
  char o_name [80];
  object *local_30;
  object *obj;
  command_conflict *pcStack_20;
  _Bool okay;
  command_conflict *cmd_local;
  wchar_t num_ac_local;
  wchar_t num_dam_local;
  wchar_t num_hit_local;
  
  obj._7_1_ = 0;
  tester = tval_is_weapon;
  if (num_ac != L'\0') {
    tester = tval_is_armor;
  }
  pcStack_20 = cmd;
  cmd_local._0_4_ = num_ac;
  cmd_local._4_4_ = num_dam;
  num_ac_local = num_hit;
  if (cmd == (command_conflict *)0x0) {
    _Var1 = get_item(&local_30,"Enchant which item? ","You have nothing to enchant.",CMD_NULL,tester
                     ,L'\x0f');
    if (!_Var1) {
      return false;
    }
  }
  else {
    wVar2 = cmd_get_item((command *)cmd,"tgtitem",&local_30,"Enchant which item? ",
                         "You have nothing to enchant.",tester,L'\x0f');
    if (wVar2 != L'\0') {
      return false;
    }
  }
  object_desc((char *)&q,0x50,local_30,0,player);
  _Var1 = object_is_carried(player,local_30);
  pcVar4 = "The";
  if (_Var1) {
    pcVar4 = "Your";
  }
  pcVar3 = "s";
  if (1 < local_30->number) {
    pcVar3 = "";
  }
  msg("%s %s glow%s brightly!",pcVar4,&q,pcVar3);
  if ((cmd_local._4_4_ == L'\0') || (_Var1 = enchant(local_30,num_ac_local,L'\x03'), !_Var1)) {
    _Var1 = enchant(local_30,num_ac_local,L'\x01');
    if (_Var1) {
      obj._7_1_ = 1;
    }
    else {
      _Var1 = enchant(local_30,cmd_local._4_4_,L'\x02');
      if (_Var1) {
        obj._7_1_ = 1;
      }
    }
  }
  else {
    obj._7_1_ = 1;
  }
  _Var1 = enchant(local_30,(wchar_t)cmd_local,L'\x04');
  if (_Var1) {
    obj._7_1_ = 1;
  }
  if ((obj._7_1_ & 1) == 0) {
    event_signal(EVENT_INPUT_FLUSH);
    msg("The enchantment failed.");
  }
  return true;
}

Assistant:

static bool enchant_spell(int num_hit, int num_dam, int num_ac, struct command *cmd)
{
	bool okay = false;

	struct object *obj;

	char o_name[80];

	const char *q, *s;
	int itemmode = (USE_EQUIP | USE_INVEN | USE_QUIVER | USE_FLOOR);
	item_tester filter = num_ac ? tval_is_armor : tval_is_weapon;

	/* Get an item */
	q = "Enchant which item? ";
	s = "You have nothing to enchant.";
	if (cmd) {
		if (cmd_get_item(cmd, "tgtitem", &obj, q, s, filter,
				itemmode)) {
			return false;
		}
	} else if (!get_item(&obj, q, s, 0, filter, itemmode))
		return false;

	/* Description */
	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, player);

	/* Describe */
	msg("%s %s glow%s brightly!",
		(object_is_carried(player, obj) ? "Your" : "The"), o_name,
			   ((obj->number > 1) ? "" : "s"));

	/* Enchant */
	if (num_dam && enchant(obj, num_hit, ENCH_TOBOTH)) okay = true;
	else if (enchant(obj, num_hit, ENCH_TOHIT)) okay = true;
	else if (enchant(obj, num_dam, ENCH_TODAM)) okay = true;
	if (enchant(obj, num_ac, ENCH_TOAC)) okay = true;

	/* Failure */
	if (!okay) {
		event_signal(EVENT_INPUT_FLUSH);

		/* Message */
		msg("The enchantment failed.");
	}

	/* Something happened */
	return (true);
}